

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O2

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>::
ContIntLoadResidual_CqL
          (ChContactNSC<chrono::ChContactable_3vars<3,_3,_3>,_chrono::ChContactable_3vars<3,_3,_3>_>
           *this,uint off_L,ChVectorDynamic<> *R,ChVectorDynamic<> *L,double c)

{
  CoeffReturnType pdVar1;
  
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L);
  ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  ::MultiplyTandAdd(&(this->Nx).
                     super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                    ,R,c * *pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                      (ulong)(off_L + 1));
  ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  ::MultiplyTandAdd(&(this->Tu).
                     super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                    ,R,c * *pdVar1);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                      (ulong)(off_L + 2));
  ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
  ::MultiplyTandAdd(&(this->Tv).
                     super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<3,_3,_3>,_chrono::ChVariableTupleCarrier_3vars<3,_3,_3>_>
                    ,R,c * *pdVar1);
  return;
}

Assistant:

virtual void ContIntLoadResidual_CqL(const unsigned int off_L,    
                                         ChVectorDynamic<>& R,        
                                         const ChVectorDynamic<>& L,  
                                         const double c               
                                         ) override {
        this->Nx.MultiplyTandAdd(R, L(off_L) * c);
        this->Tu.MultiplyTandAdd(R, L(off_L + 1) * c);
        this->Tv.MultiplyTandAdd(R, L(off_L + 2) * c);
    }